

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O0

int doforce(void)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  bool local_a9;
  char local_a8 [8];
  char qbuf [128];
  int picktyp;
  int c;
  obj *otmp;
  
  if ((uwep == (obj *)0x0) ||
     ((((uwep->oclass != '\x02' &&
        (((uwep->oclass != '\x06' || (objects[uwep->otyp].oc_subtyp == '\0')) &&
         (uwep->oclass != '\x0e')))) ||
       (((objects[uwep->otyp].oc_subtyp < '\x01' || ('\x15' < objects[uwep->otyp].oc_subtyp)) ||
        (uwep->otyp == 0x40)))) || ((uwep->otyp == 0x3f || (uwep->otyp == 0x3d)))))) {
    pcVar4 = "";
    if (uwep != (obj *)0x0) {
      pcVar4 = "proper ";
    }
    pline("You can\'t force anything without a %sweapon.",pcVar4);
    otmp._4_4_ = 0;
  }
  else {
    local_a9 = false;
    if ((uwep->oclass == '\x02') && (local_a9 = false, '\0' < objects[uwep->otyp].oc_subtyp)) {
      local_a9 = objects[uwep->otyp].oc_subtyp < '\v';
    }
    uVar2 = (uint)local_a9;
    if (((xlock.usedtime == 0) || (xlock.box == (obj *)0x0)) || (uVar2 != xlock.picktyp)) {
      xlock.box = (obj *)0x0;
      for (_picktyp = level->objects[u.ux][u.uy]; _picktyp != (obj *)0x0;
          _picktyp = (_picktyp->v).v_nexthere) {
        if (((_picktyp->otyp == 0xda) || (_picktyp->otyp == 0xdb)) || (_picktyp->otyp == 0xdc)) {
          if (_picktyp->otyp == 0xdc) {
            pcVar4 = xname(_picktyp);
            pcVar4 = the(pcVar4);
            pline("You have no way to force %s",pcVar4);
          }
          else if (((*(uint *)&_picktyp->field_0x4a >> 0xe & 1) == 0) &&
                  ((*(uint *)&_picktyp->field_0x4a >> 0xd & 1) != 0)) {
            pcVar4 = doname(_picktyp);
            pcVar3 = simple_typename((int)_picktyp->otyp);
            pcVar3 = an(pcVar3);
            pcVar4 = safe_qbuf("",0x20,pcVar4,pcVar3,"a box");
            sprintf(local_a8,"There is %s here, force its lock?",pcVar4);
            cVar1 = yn_function(local_a8,"ynq",'q');
            if (cVar1 == 'q') {
              return 0;
            }
            if (cVar1 != 'n') {
              if (uVar2 == 0) {
                pcVar4 = xname(uwep);
                pline("You start bashing it with your %s.",pcVar4);
              }
              else {
                pcVar4 = xname(uwep);
                pline("You force your %s into a crack and pry.",pcVar4);
              }
              xlock.box = _picktyp;
              xlock.chance = (int)objects[uwep->otyp].oc_wldam << 1;
              xlock.usedtime = 0;
              xlock.picktyp = uVar2;
              break;
            }
          }
          else {
            pcVar4 = doname(_picktyp);
            pcVar3 = "unlocked";
            if ((*(uint *)&_picktyp->field_0x4a >> 0xe & 1) != 0) {
              pcVar3 = "broken";
            }
            pline("There is %s here, but its lock is already %s.",pcVar4,pcVar3);
          }
        }
      }
      if (xlock.box == (obj *)0x0) {
        pline("You decide not to force the issue.");
      }
      else {
        set_occupation(forcelock,"forcing the lock",0);
      }
      otmp._4_4_ = 1;
    }
    else {
      pline("You resume your attempt to force the lock.");
      set_occupation(forcelock,"forcing the lock",0);
      otmp._4_4_ = 1;
    }
  }
  return otmp._4_4_;
}

Assistant:

int doforce(void)
{
	struct obj *otmp;
	int c, picktyp;
	char qbuf[QBUFSZ];

	if (!uwep ||	/* proper type test */
	    (uwep->oclass != WEAPON_CLASS && !is_weptool(uwep) &&
	     uwep->oclass != ROCK_CLASS) ||
	    (objects[uwep->otyp].oc_skill < P_DAGGER) ||
	    (objects[uwep->otyp].oc_skill > P_LANCE) ||
	    uwep->otyp == FLAIL || uwep->otyp == AKLYS ||
	    uwep->otyp == RUBBER_HOSE) {
	    pline("You can't force anything without a %sweapon.", (uwep) ? "proper " : "");
	    return 0;
	}

	picktyp = is_blade(uwep);
	if (xlock.usedtime && xlock.box && picktyp == xlock.picktyp) {
	    pline("You resume your attempt to force the lock.");
	    set_occupation(forcelock, "forcing the lock", 0);
	    return 1;
	}

	/* A lock is made only for the honest man, the thief will break it. */
	xlock.box = NULL;
	for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere)
	    if (Is_box(otmp)) {
		if (otmp->otyp == IRON_SAFE) {
		    pline("You have no way to force %s", the(xname(otmp)));
		    continue;
		}
		if (otmp->obroken || !otmp->olocked) {
		    pline("There is %s here, but its lock is already %s.",
			  doname(otmp), otmp->obroken ? "broken" : "unlocked");
		    continue;
		}
		sprintf(qbuf,"There is %s here, force its lock?",
			safe_qbuf("", sizeof("There is  here, force its lock?"),
				doname(otmp), an(simple_typename(otmp->otyp)),
				"a box"));

		c = ynq(qbuf);
		if (c == 'q') return 0;
		if (c == 'n') continue;

		if (picktyp)
		    pline("You force your %s into a crack and pry.", xname(uwep));
		else
		    pline("You start bashing it with your %s.", xname(uwep));
		xlock.box = otmp;
		xlock.chance = objects[uwep->otyp].oc_wldam * 2;
		xlock.picktyp = picktyp;
		xlock.usedtime = 0;
		break;
	    }

	if (xlock.box)	set_occupation(forcelock, "forcing the lock", 0);
	else		pline("You decide not to force the issue.");
	return 1;
}